

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O2

void __thiscall
kj::_::
AdapterPromiseNode<kj::Rc<kj::Refcounted>,_kj::Canceler::AdapterImpl<kj::Rc<kj::Refcounted>_>_>::
reject(AdapterPromiseNode<kj::Rc<kj::Refcounted>,_kj::Canceler::AdapterImpl<kj::Rc<kj::Refcounted>_>_>
       *this,Exception *exception)

{
  ExceptionOr<kj::Rc<kj::Refcounted>_> EStack_1c8;
  
  if (this->waiting == true) {
    this->waiting = false;
    NullableValue<kj::Exception>::NullableValue
              ((NullableValue<kj::Exception> *)&EStack_1c8,exception);
    EStack_1c8.value.ptr.isSet = false;
    ExceptionOr<kj::Rc<kj::Refcounted>_>::operator=(&this->result,&EStack_1c8);
    ExceptionOr<kj::Rc<kj::Refcounted>_>::~ExceptionOr(&EStack_1c8);
    PromiseNode::OnReadyEvent::arm(&(this->super_AdapterPromiseNodeBase).onReadyEvent);
  }
  return;
}

Assistant:

void reject(Exception&& exception) override {
    if (waiting) {
      waiting = false;
      result = ExceptionOr<T>(false, kj::mv(exception));
      setReady();
    }
  }